

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,optional<Network> network)

{
  FastRandomContext *this_00;
  int (*paiVar1) [64];
  undefined8 uVar2;
  uint uVar3;
  ServiceFlags SVar4;
  string_view source_file;
  bool bVar5;
  bool bVar6;
  Network NVar7;
  long lVar8;
  const_iterator cVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  const_iterator cVar12;
  time_point tVar13;
  Logger *pLVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  char **in_R8;
  int bits;
  uint64_t maxval;
  ulong uVar18;
  long in_FS_OFFSET;
  double dVar19;
  undefined1 auVar20 [16];
  string_view str;
  string_view logging_function;
  int node_id;
  string log_msg;
  double local_150;
  undefined1 local_110 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [7];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_110._16_8_ =
       network.super__Optional_base<Network,_true,_true>._M_payload.
       super__Optional_payload_base<Network>;
  if ((this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    CService::CService((CService *)__return_storage_ptr__);
    (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->first).nServices = NODE_NONE;
      (__return_storage_ptr__->second).__d.__r = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0084b1cc;
  }
  if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
    lVar15 = (long)this->nNew;
    lVar8 = (long)this->nTried;
LAB_0084aa9f:
    if (((!new_only) || (lVar15 != 0)) && (lVar15 + lVar8 != 0)) {
      if (lVar15 != 0 && (!new_only && lVar8 != 0)) {
        uVar10 = RandomMixin<FastRandomContext>::randbits<1>
                           (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
        bVar6 = uVar10 != 0;
      }
      else {
        bVar6 = !new_only && lVar8 != 0;
      }
      this_00 = &this->insecure_rand;
      uVar18 = 0x3ff;
      if (bVar6) {
        uVar18 = 0xff;
      }
      uVar3 = 0x1f;
      if ((uint)uVar18 != 0) {
        for (; (uint)uVar18 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      local_150 = 1.0;
      do {
        do {
          uVar10 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,
                              (uVar3 ^ 0xffffffe0) + 0x21);
        } while (uVar18 < uVar10);
        do {
          uVar11 = RandomMixin<FastRandomContext>::randbits
                             (&this_00->super_RandomMixin<FastRandomContext>,6);
        } while (0x3f < uVar11);
        uVar16 = (ulong)(int)uVar10;
        iVar17 = 0;
        do {
          if (bVar6) {
            paiVar1 = this->vvTried;
            if (uVar16 < 0x100) {
LAB_0084abd0:
              local_110._8_4_ = paiVar1[uVar16][(int)uVar11 + iVar17 & 0x3f];
              if (local_110._8_4_ != -1) {
                if ((bool)local_110[0x14] != true) {
LAB_0084ac2c:
                  cVar12 = std::
                           _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(this->mapInfo)._M_h,(key_type_conflict2 *)(local_110 + 8));
                  if (cVar12.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur
                      == (__node_type *)0x0) {
                    __assert_fail("it_found != mapInfo.end()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                                  ,0x307,
                                  "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, std::optional<Network>) const"
                                 );
                  }
                  uVar10 = RandomMixin<FastRandomContext>::randbits<30>
                                     (&this_00->super_RandomMixin<FastRandomContext>);
                  auVar20._8_4_ = (int)(uVar10 >> 0x20);
                  auVar20._0_8_ = uVar10;
                  auVar20._12_4_ = 0x45300000;
                  tVar13 = NodeClock::now();
                  lVar15 = *(long *)((long)cVar12.
                                           super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                           ._M_cur + 0x48);
                  iVar17 = *(int *)((long)cVar12.
                                          super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                          ._M_cur + 0x80);
                  if (7 < iVar17) {
                    iVar17 = 8;
                  }
                  dVar19 = pow(0.66,(double)iVar17);
                  if ((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0) <
                      dVar19 * *(double *)
                                (&DAT_00f95580 +
                                (ulong)((long)tVar13.__d.__r / 1000000000 - lVar15 < 600) * 8) *
                      local_150 * 1073741824.0) {
                    pLVar14 = LogInstance();
                    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar14,ADDRMAN,Debug);
                    if (bVar5) {
                      CService::ToStringAddrPort_abi_cxx11_
                                ((string *)(local_110 + 0x18),
                                 (CService *)
                                 ((long)cVar12.
                                        super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                        ._M_cur + 0x10));
                      local_110._0_8_ = "new";
                      if (bVar6) {
                        local_110._0_8_ = "tried";
                      }
                      pLVar14 = LogInstance();
                      bVar6 = BCLog::Logger::Enabled(pLVar14);
                      if (bVar6) {
                        local_58._M_string_length = 0;
                        local_58.field_2._M_local_buf[0] = '\0';
                        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                        tinyformat::format<std::__cxx11::string,char_const*>
                                  (&local_78,(tinyformat *)"Selected %s from %s\n",local_110 + 0x18,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_110,in_R8);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  (&local_58,&local_78);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_78._M_dataplus._M_p != &local_78.field_2) {
                          operator_delete(local_78._M_dataplus._M_p,
                                          local_78.field_2._M_allocated_capacity + 1);
                        }
                        pLVar14 = LogInstance();
                        local_78._M_dataplus._M_p = (pointer)0x54;
                        local_78._M_string_length = 0xf955a8;
                        source_file._M_str =
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                        ;
                        source_file._M_len = 0x54;
                        str._M_str = local_58._M_dataplus._M_p;
                        str._M_len = local_58._M_string_length;
                        logging_function._M_str = "Select_";
                        logging_function._M_len = 7;
                        BCLog::Logger::LogPrintStr
                                  (pLVar14,str,logging_function,source_file,0x30c,ADDRMAN,Debug);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_58._M_dataplus._M_p != &local_58.field_2) {
                          operator_delete(local_58._M_dataplus._M_p,
                                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                                   local_58.field_2._M_local_buf[0]) + 1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_110._24_8_ != local_e8) {
                        operator_delete((void *)local_110._24_8_,
                                        local_e8[0]._M_allocated_capacity + 1);
                      }
                    }
                    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               __return_storage_ptr__,
                               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               ((long)cVar12.
                                      super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                      ._M_cur + 0x10));
                    uVar2 = *(undefined8 *)
                             ((long)cVar12.
                                    super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                    ._M_cur + 0x28);
                    (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_net = (int)uVar2
                    ;
                    (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_scope_id =
                         (int)((ulong)uVar2 >> 0x20);
                    (__return_storage_ptr__->first).super_CService.port =
                         *(uint16_t *)
                          ((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                                 _M_cur + 0x30);
                    SVar4 = *(ServiceFlags *)
                             ((long)cVar12.
                                    super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                    ._M_cur + 0x40);
                    (__return_storage_ptr__->first).nTime.__d.__r =
                         *(rep *)((long)cVar12.
                                        super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                        ._M_cur + 0x38);
                    (__return_storage_ptr__->first).nServices = SVar4;
                    (__return_storage_ptr__->second).__d.__r =
                         *(rep *)((long)cVar12.
                                        super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                        ._M_cur + 0x48);
                    goto LAB_0084adb9;
                  }
                  local_150 = local_150 * 1.2;
                  break;
                }
                cVar12 = std::
                         _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&(this->mapInfo)._M_h,(key_type_conflict2 *)(local_110 + 8));
                if (cVar12.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur
                    != (__node_type *)0x0) {
                  NVar7 = CNetAddr::GetNetwork
                                    ((CNetAddr *)
                                     ((long)cVar12.
                                            super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                            ._M_cur + 0x10));
                  if (NVar7 == local_110._16_4_) goto LAB_0084ac2c;
                }
              }
            }
          }
          else {
            paiVar1 = this->vvNew;
            if (uVar16 < 0x400) goto LAB_0084abd0;
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != 0x40);
      } while( true );
    }
  }
  else {
    cVar9 = std::
            _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_network_counts)._M_h,(key_type *)(local_110 + 0x10));
    if (cVar9.super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar15 = *(long *)((long)cVar9.
                               super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                               ._M_cur + 0x10);
      lVar8 = *(long *)((long)cVar9.
                              super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                              ._M_cur + 0x18);
      goto LAB_0084aa9f;
    }
  }
  CService::CService((CService *)__return_storage_ptr__);
  (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
  (__return_storage_ptr__->first).nServices = NODE_NONE;
  (__return_storage_ptr__->second).__d.__r = 0;
LAB_0084adb9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0084b1cc:
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, std::optional<Network> network) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (network.has_value()) {
        auto it = m_network_counts.find(*network);
        if (it == m_network_counts.end()) return {};

        auto counts = it->second;
        new_count = counts.n_new;
        tried_count = counts.n_tried;
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position, node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (network.has_value()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && it->second.GetNetwork() == *network) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}